

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomElement __thiscall
QDomNode::previousSiblingElement(QDomNode *this,QString *tagName,QString *namespaceURI)

{
  bool bVar1;
  bool bVar2;
  QDomNodePrivate *in_RDI;
  long in_FS_OFFSET;
  QDomElement *elt;
  QDomNode sib;
  uint in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  byte in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar3;
  QDomNode this_00;
  undefined1 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff91;
  byte in_stack_ffffffffffffff92;
  byte bVar4;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar5;
  QDomNode local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.impl = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  this_00.impl = in_RDI;
  previousSibling((QDomNode *)in_RDI);
  while (bVar1 = isNull(&local_10), ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar2 = isElement((QDomNode *)
                      CONCAT17(in_stack_ffffffffffffff7f,
                               CONCAT16(in_stack_ffffffffffffff7e,
                                        CONCAT15(in_stack_ffffffffffffff7d,
                                                 CONCAT14(in_stack_ffffffffffffff7c,
                                                          in_stack_ffffffffffffff78)))));
    bVar4 = 0;
    uVar3 = false;
    bVar1 = (bool)uVar3;
    if (bVar2) {
      bVar2 = QString::isEmpty((QString *)0x111efd);
      in_stack_ffffffffffffff7e = true;
      bVar1 = (bool)in_stack_ffffffffffffff7e;
      if (!bVar2) {
        QDomNode::namespaceURI((QDomNode *)this_00.impl);
        bVar4 = 1;
        in_stack_ffffffffffffff7e =
             ::operator==((QString *)in_RDI,
                          (QString *)
                          CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff7e,
                                                  CONCAT15(in_stack_ffffffffffffff7d,
                                                           CONCAT14(in_stack_ffffffffffffff7c,
                                                                    in_stack_ffffffffffffff78)))));
        bVar1 = (bool)in_stack_ffffffffffffff7e;
      }
    }
    in_stack_ffffffffffffff7d = bVar1;
    in_stack_ffffffffffffff7f = in_stack_ffffffffffffff7d;
    if ((bVar4 & 1) != 0) {
      QString::~QString((QString *)0x111f54);
    }
    if ((in_stack_ffffffffffffff7d & 1) != 0) {
      in_stack_ffffffffffffff92 = 0;
      in_RDI->_vptr_QDomNodePrivate = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      toElement((QDomNode *)this_00.impl);
      bVar1 = QString::isEmpty((QString *)0x111f89);
      in_stack_ffffffffffffff91 = 0;
      in_stack_ffffffffffffff7c = true;
      if (!bVar1) {
        QDomElement::tagName((QDomElement *)this_00.impl);
        in_stack_ffffffffffffff91 = 1;
        in_stack_ffffffffffffff7c =
             ::operator==((QString *)in_RDI,
                          (QString *)
                          CONCAT17(in_stack_ffffffffffffff7f,
                                   CONCAT16(in_stack_ffffffffffffff7e,
                                            CONCAT15(in_stack_ffffffffffffff7d,
                                                     CONCAT14(in_stack_ffffffffffffff7c,
                                                              in_stack_ffffffffffffff78)))));
      }
      in_stack_ffffffffffffff78 =
           CONCAT13(in_stack_ffffffffffffff7c,(int3)in_stack_ffffffffffffff78);
      if ((in_stack_ffffffffffffff91 & 1) != 0) {
        QString::~QString((QString *)0x111fdd);
      }
      bVar1 = (in_stack_ffffffffffffff78 & 0x1000000) != 0;
      if (bVar1) {
        in_stack_ffffffffffffff92 = 1;
      }
      uVar5 = (uint)bVar1;
      if ((in_stack_ffffffffffffff92 & 1) == 0) {
        QDomElement::~QDomElement((QDomElement *)0x11200f);
      }
      if (uVar5 != 0) goto LAB_0011204a;
      in_stack_ffffffffffffff94 = 0;
    }
    previousSibling((QDomNode *)this_00.impl);
    operator=((QDomNode *)
              CONCAT44(in_stack_ffffffffffffff94,
                       CONCAT13(bVar4,CONCAT12(in_stack_ffffffffffffff92,
                                               CONCAT11(in_stack_ffffffffffffff91,
                                                        in_stack_ffffffffffffff90)))),
              (QDomNode *)this_00.impl);
    ~QDomNode((QDomNode *)in_RDI);
  }
  uVar5 = 2;
LAB_0011204a:
  ~QDomNode((QDomNode *)in_RDI);
  if (uVar5 != 1) {
    QDomElement::QDomElement((QDomElement *)0x112069);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDomElement)(QDomNode)this_00.impl;
}

Assistant:

QDomElement QDomNode::previousSiblingElement(const QString &tagName, const QString &namespaceURI) const
{
    for (QDomNode sib = previousSibling(); !sib.isNull(); sib = sib.previousSibling()) {
        if (sib.isElement() && (namespaceURI.isEmpty() || sib.namespaceURI() == namespaceURI)) {
            QDomElement elt = sib.toElement();
            if (tagName.isEmpty() || elt.tagName() == tagName)
                return elt;
        }
    }
    return QDomElement();
}